

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_iarchive.h
# Opt level: O2

size_type __thiscall serialization::xml_iarchive::load_sequence_start(xml_iarchive *this)

{
  char *pcVar1;
  xml_node<char> *this_00;
  xml_attribute<char> *pxVar2;
  ulonglong uVar3;
  _Elt_pointer ppxVar4;
  char *pcVar5;
  char *pcVar6;
  xml_node<char> *node;
  char *end;
  
  ppxVar4 = (this->stack_).c.
            super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppxVar4 ==
      (this->stack_).c.
      super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppxVar4 = (this->stack_).c.
              super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  this_00 = rapidxml::xml_node<char>::first_node(ppxVar4[-1],"sequence",0,true);
  node = this_00;
  if (this_00 == (xml_node<char> *)0x0) {
    throw_serialization_error("load_sequence_start","expect sequence");
  }
  pxVar2 = rapidxml::xml_node<char>::first_attribute(this_00,"size",0,true);
  if (pxVar2 == (xml_attribute<char> *)0x0) {
    throw_serialization_error("load_sequence_start","expect sequence size");
  }
  end = (pxVar2->super_xml_base<char>).m_value;
  if (end == (char *)0x0) {
    end = &rapidxml::xml_base<char>::nullstr()::zero;
  }
  uVar3 = strtoull(end,&end,10);
  pcVar1 = (pxVar2->super_xml_base<char>).m_value;
  pcVar5 = pcVar1;
  pcVar6 = &rapidxml::xml_base<char>::nullstr()::zero;
  if (pcVar1 != (char *)0x0) {
    pcVar5 = (char *)(pxVar2->super_xml_base<char>).m_value_size;
    pcVar6 = pcVar1;
  }
  if (end + -(long)pcVar6 != pcVar5) {
    throw_serialization_error("load_sequence_start","bad sequence size");
  }
  std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>::
  push_back(&(this->stack_).c,&node);
  if ((size_type)uVar3 == 0) {
    node = (xml_node<char> *)0x0;
  }
  else {
    ppxVar4 = (this->stack_).c.
              super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppxVar4 ==
        (this->stack_).c.
        super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppxVar4 = (this->stack_).c.
                super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    node = rapidxml::xml_node<char>::first_node(ppxVar4[-1],"item",0,true);
  }
  std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>::
  push_back(&(this->stack_).c,&node);
  return (size_type)uVar3;
}

Assistant:

size_type load_sequence_start() const
    {
        serialization_trace trace(__func__, "xml");
        auto node = stack_.top()->first_node("sequence");
        if(node == nullptr)
        {
            throw_serialization_error(__func__, "expect sequence");
        }
        auto attr = node->first_attribute("size");
        if(attr == nullptr)
        {
            throw_serialization_error(__func__, "expect sequence size");
        }

        char *end = attr->value();
        size_type size = std::strtoull(attr->value(), &end, 10);
        if(end - attr->value() != attr->value_size())
        {
            throw_serialization_error(__func__, "bad sequence size");
        }

        stack_.push(node);
        node = (size == 0 ? nullptr : stack_.top()->first_node("item"));
        stack_.push(node);

        return size;
    }